

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O2

void __thiscall
boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>::
on<boost::ext::ut::v1_1_8::detail::eq_<double,boost::ext::ut::v1_1_8::detail::integral_constant<3>>>
          (reporter<boost::ext::ut::v1_1_8::printer> *this,
          assertion_fail<boost::ext::ut::v1_1_8::detail::eq_<double,_boost::ext::ut::v1_1_8::detail::integral_constant<3>_>_>
          assertion)

{
  undefined1 *this_00;
  size_t *psVar1;
  char *pcVar2;
  size_t sVar3;
  printer *ppVar4;
  printer *ppVar5;
  string_view name;
  anon_class_1_0_00000001 local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  ppVar5 = &this->printer_;
  std::operator<<((ostream *)&(this->printer_).field_0x40,"\n  ");
  pcVar2 = assertion.location.file_;
  sVar3 = strlen(assertion.location.file_);
  name._M_str = pcVar2;
  name._M_len = sVar3;
  local_40 = on<boost::ext::ut::v1_1_8::detail::eq_<double,_boost::ext::ut::v1_1_8::detail::integral_constant<3>_>_>
             ::anon_class_1_0_00000001::operator()(&local_41,name);
  ppVar4 = printer::operator<<(ppVar5,&local_40);
  this_00 = &ppVar4->field_0x40;
  std::operator<<((ostream *)this_00,':');
  std::ostream::operator<<(this_00,assertion.location.line_);
  std::operator<<((ostream *)this_00,':');
  ppVar4 = printer::operator<<(ppVar4,&(this->printer_).colors_.fail);
  std::operator<<((ostream *)&ppVar4->field_0x40,"FAILED");
  ppVar4 = printer::operator<<(ppVar4,(basic_string_view<char,_std::char_traits<char>_> *)ppVar5);
  std::operator<<((ostream *)&ppVar4->field_0x40," [");
  *(uint *)(&ppVar4->field_0x58 + *(long *)(*(long *)&ppVar4->field_0x40 + -0x18)) =
       *(uint *)(&ppVar4->field_0x58 + *(long *)(*(long *)&ppVar4->field_0x40 + -0x18)) | 1;
  ppVar4 = printer::operator<<(ppVar4,&assertion.expr);
  ppVar5 = printer::operator<<(ppVar4,(basic_string_view<char,_std::char_traits<char>_> *)ppVar5);
  std::operator<<((ostream *)&ppVar5->field_0x40,']');
  psVar1 = &(this->asserts_).fail;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

auto on(events::assertion_fail<TExpr> assertion) -> void {
      constexpr auto short_name = [](std::string_view name) {
        return name.rfind('/') != std::string_view::npos
                   ? name.substr(name.rfind('/') + 1)
                   : name;
      };
      printer_ << "\n  " << short_name(assertion.location.file_name()) << ':'
               << assertion.location.line() << ':' << printer_.colors().fail
               << "FAILED" << printer_.colors().none << " [" << std::boolalpha
               << assertion.expr << printer_.colors().none << ']';
      ++asserts_.fail;
    }